

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_move_val_anchor_to_key_anchor(Parser *this)

{
  code *pcVar1;
  size_t sVar2;
  bool bVar3;
  csubstr fmt;
  
  if ((this->m_val_anchor).str != (char *)0x0 && (this->m_val_anchor).len != 0) {
    bVar3 = _token_is_from_this_line(this,this->m_val_anchor);
    if (bVar3) {
      if (((this->m_key_anchor).len != 0) && ((this->m_key_anchor).str != (char *)0x0)) {
        bVar3 = is_debugger_attached();
        if (bVar3) {
          bVar3 = is_debugger_attached();
          if (bVar3) {
            pcVar1 = (code *)swi(3);
            (*pcVar1)();
            return;
          }
        }
        fmt.len = 0x1c;
        fmt.str = "ERROR: triple-pending anchor";
        _err<>(this,fmt);
      }
      sVar2 = (this->m_val_anchor).len;
      (this->m_key_anchor).str = (this->m_val_anchor).str;
      (this->m_key_anchor).len = sVar2;
      this->m_key_anchor_indentation = this->m_val_anchor_indentation;
      this->m_val_anchor_indentation = 0;
      (this->m_val_anchor).str = (char *)0x0;
      (this->m_val_anchor).len = 0;
    }
  }
  return;
}

Assistant:

C4_ALWAYS_INLINE C4_PURE bool   empty()     const noexcept { return (len == 0 || str == nullptr); }